

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psac_vs_dss.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  unsigned_long uVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 uVar3;
  streambuf *psVar4;
  unsigned_long *puVar5;
  ostream *poVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  rep rVar9;
  rep rVar10;
  ArgException *e;
  double end_1;
  double start_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> SA;
  timer t_2;
  undefined1 local_cc8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> glSA;
  double end;
  comm local_ca0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c80;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c78;
  undefined1 local_c70 [8];
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  sa;
  double start;
  timer t;
  comm local_b80;
  mxx local_b60 [8];
  string local_str;
  string local_b40 [32];
  string local_b20 [32];
  stringstream local_b00 [8];
  stringstream buffer;
  undefined1 local_af0 [376];
  undefined1 local_978 [8];
  ifstream t_1;
  string local_770 [8];
  string input_str;
  allocator local_749;
  string local_748 [39];
  allocator local_721;
  string local_720 [39];
  allocator local_6f9;
  string local_6f8 [32];
  undefined1 local_6d8 [8];
  SwitchArg checkArg;
  string local_628 [39];
  allocator local_601;
  string local_600 [39];
  allocator local_5d9;
  string local_5d8 [39];
  allocator local_5b1;
  string local_5b0 [32];
  undefined1 local_590 [8];
  ValueArg<int> seedArg;
  string local_4b0 [39];
  allocator local_489;
  string local_488 [39];
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [32];
  undefined1 local_418 [8];
  ValueArg<unsigned_long> randArg;
  string local_330 [39];
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [39];
  allocator local_291;
  string local_290 [32];
  undefined1 local_270 [8];
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> fileArg
  ;
  string local_158 [55];
  allocator local_121;
  string local_120 [32];
  undefined1 local_100 [8];
  CmdLine cmd;
  char **ppcStack_18;
  int rank;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  MPI_Init(&argv_local,&stack0xffffffffffffffe8);
  MPI_Comm_rank(&ompi_mpi_comm_world,&cmd.field_0xdc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_120,"Compare our parallel implementation with divsufsort.",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"none",(allocator *)((long)&fileArg._constraint + 7));
  TCLAP::CmdLine::CmdLine((CmdLine *)local_100,(string *)local_120,' ',(string *)local_158,true);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)((long)&fileArg._constraint + 7));
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"f",&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"file",&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"Input filename.",&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"",&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_330,"filename",(allocator *)((long)&randArg._constraint + 7));
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_270,(string *)local_290,(string *)local_2b8,(string *)local_2e0,true,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
             (string *)local_330,(Visitor *)0x0);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator((allocator<char> *)((long)&randArg._constraint + 7));
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"r",&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_460,"random",&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_488,"Random input size",&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b0,"size",(allocator *)((long)&seedArg._constraint + 7));
  TCLAP::ValueArg<unsigned_long>::ValueArg
            ((ValueArg<unsigned_long> *)local_418,(string *)local_438,(string *)local_460,
             (string *)local_488,true,0,(string *)local_4b0,(Visitor *)0x0);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&seedArg._constraint + 7));
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b0,"s",&local_5b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5d8,"seed",&local_5d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_600,"Sets the seed for the ranom input generation",&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_628,"int",(allocator *)&checkArg.super_Arg.field_0xa7);
  TCLAP::ValueArg<int>::ValueArg
            ((ValueArg<int> *)local_590,(string *)local_5b0,(string *)local_5d8,(string *)local_600,
             false,0,(string *)local_628,(Visitor *)0x0);
  std::__cxx11::string::~string(local_628);
  std::allocator<char>::~allocator((allocator<char> *)&checkArg.super_Arg.field_0xa7);
  std::__cxx11::string::~string(local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  std::__cxx11::string::~string(local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  TCLAP::CmdLine::add((CmdLine *)local_100,(Arg *)local_590);
  TCLAP::CmdLine::xorAdd((CmdLine *)local_100,(Arg *)local_270,(Arg *)local_418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f8,"c",&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_720,"check",&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_748,"Check correctness of SA for PSAC using divsufsort `sufcheck()`.",&local_749)
  ;
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)local_6d8,(string *)local_6f8,(string *)local_720,(string *)local_748,
             false,(Visitor *)0x0);
  std::__cxx11::string::~string(local_748);
  std::allocator<char>::~allocator((allocator<char> *)&local_749);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_721);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  TCLAP::CmdLine::add((CmdLine *)local_100,(Arg *)local_6d8);
  TCLAP::CmdLine::parse((CmdLine *)local_100,(int)argv_local,ppcStack_18);
  std::__cxx11::string::string(local_770);
  if (cmd._220_4_ == 0) {
    __lhs = TCLAP::
            ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_270);
    bVar2 = std::operator!=(__lhs,"");
    if (bVar2) {
      TCLAP::
      ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      getValue((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_270);
      uVar3 = std::__cxx11::string::c_str();
      std::ifstream::ifstream(local_978,uVar3,8);
      std::__cxx11::stringstream::stringstream(local_b00);
      psVar4 = (streambuf *)std::ifstream::rdbuf();
      std::ostream::operator<<(local_af0,psVar4);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=(local_770,local_b20);
      std::__cxx11::string::~string(local_b20);
      std::__cxx11::stringstream::~stringstream(local_b00);
      std::ifstream::~ifstream(local_978);
    }
    else {
      puVar5 = TCLAP::ValueArg<unsigned_long>::getValue((ValueArg<unsigned_long> *)local_418);
      uVar1 = *puVar5;
      TCLAP::ValueArg<int>::getValue((ValueArg<int> *)local_590);
      rand_dna_abi_cxx11_((size_t)local_b40,(int)uVar1);
      std::__cxx11::string::operator=(local_770,local_b40);
      std::__cxx11::string::~string(local_b40);
    }
  }
  t.start.__d.__r = (time_point)&ompi_mpi_comm_world;
  mxx::comm::comm(&local_b80,(MPI_Comm *)&t);
  mxx::stable_distribute<char,std::char_traits<char>,std::allocator<char>>
            (local_b60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_770,
             &local_b80);
  mxx::comm::~comm(&local_b80);
  mxx::timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::timer_impl
            ((timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)&start);
  sa.local_LCP.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)mxx::timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::elapsed
                          ((timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                           &start);
  local_c78._M_current = (char *)std::__cxx11::string::begin();
  local_c80._M_current = (char *)std::__cxx11::string::end();
  end = (double)&ompi_mpi_comm_world;
  mxx::comm::comm(&local_ca0,(MPI_Comm *)&end);
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  ::suffix_array((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                  *)local_c70,local_c78,local_c80,&local_ca0);
  mxx::comm::~comm(&local_ca0);
  suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>::
  construct_arr<2ul>((suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                      *)local_c70,true);
  rVar9 = mxx::timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::elapsed
                    ((timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)&start);
  glSA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(rVar9 - (double)sa.local_LCP.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (cmd._220_4_ == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"PSAC time: ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(double)glSA.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar6 = std::operator<<(poVar6," ms");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  mxx::comm::comm((comm *)&t_2);
  mxx::gatherv<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_cc8,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sa.part.div1mod,0,
             (comm *)&t_2);
  mxx::comm::~comm((comm *)&t_2);
  if (cmd._220_4_ == 0) {
    mxx::timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::timer_impl
              ((timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
               &SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&start_1);
    rVar9 = mxx::timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::elapsed
                      ((timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                       &SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage);
    _Var7._M_current = (char *)std::__cxx11::string::begin();
    _Var8._M_current = (char *)std::__cxx11::string::end();
    dss::construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long>
              (_Var7,_Var8,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&start_1);
    rVar10 = mxx::timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::elapsed
                       ((timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                        &SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar6 = std::operator<<((ostream *)&std::cerr,"divsufsort time: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,rVar10 - rVar9);
    poVar6 = std::operator<<(poVar6," ms");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    bVar2 = TCLAP::SwitchArg::getValue((SwitchArg *)local_6d8);
    if (bVar2) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Checking for correctness...");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      _Var7._M_current = (char *)std::__cxx11::string::begin();
      _Var8._M_current = (char *)std::__cxx11::string::end();
      bVar2 = dss::check<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long>
                        (_Var7,_Var8,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_cc8);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        _Var7._M_current = (char *)std::__cxx11::string::begin();
        _Var8._M_current = (char *)std::__cxx11::string::end();
        bVar2 = dss::check<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long>
                          (_Var7,_Var8,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&start_1);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"ERROR: wrong suffix array from divsufsort"
                                  );
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
        goto LAB_00157629;
      }
      poVar6 = std::operator<<((ostream *)&std::cerr,"ERROR: wrong suffix array from PSAC");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 0;
      bVar2 = true;
    }
    else {
LAB_00157629:
      bVar2 = false;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&start_1);
    if (bVar2) goto LAB_00157657;
  }
  bVar2 = false;
LAB_00157657:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_cc8);
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  ::~suffix_array((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                   *)local_c70);
  std::__cxx11::string::~string((string *)local_b60);
  std::__cxx11::string::~string(local_770);
  TCLAP::SwitchArg::~SwitchArg((SwitchArg *)local_6d8);
  TCLAP::ValueArg<int>::~ValueArg((ValueArg<int> *)local_590);
  TCLAP::ValueArg<unsigned_long>::~ValueArg((ValueArg<unsigned_long> *)local_418);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg((ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_270);
  TCLAP::CmdLine::~CmdLine((CmdLine *)local_100);
  if (!bVar2) {
    MPI_Finalize();
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    // set up MPI
    MPI_Init(&argc, &argv);
    int rank;
    MPI_Comm_rank(MPI_COMM_WORLD, &rank);

    try {
    // define commandline usage
    TCLAP::CmdLine cmd("Compare our parallel implementation with divsufsort.");
    TCLAP::ValueArg<std::string> fileArg("f", "file", "Input filename.", true, "", "filename");
    TCLAP::ValueArg<std::size_t> randArg("r", "random", "Random input size", true, 0, "size");
    TCLAP::ValueArg<int> seedArg("s", "seed", "Sets the seed for the ranom input generation", false, 0, "int");
    cmd.add(seedArg);
    cmd.xorAdd(fileArg, randArg);
    TCLAP::SwitchArg  checkArg("c", "check", "Check correctness of SA for PSAC using divsufsort `sufcheck()`.", false);
    cmd.add(checkArg);
    cmd.parse(argc, argv);

    // read input file or generate input on master processor
    std::string input_str;
    if (rank == 0) {
        if (fileArg.getValue() != "") {
            std::ifstream t(fileArg.getValue().c_str());
            std::stringstream buffer;
            buffer << t.rdbuf();
            input_str = buffer.str();
        } else {
            input_str = rand_dna(randArg.getValue(), seedArg.getValue());
        }
    }

    // TODO differentiate between index types

    // run our distributed suffix array construction
    std::string local_str = mxx::stable_distribute(input_str, MPI_COMM_WORLD);
    mxx::timer t;
    double start = t.elapsed();
    suffix_array<std::string::iterator, index_t, false> sa(local_str.begin(), local_str.end(), MPI_COMM_WORLD);
    // TODO: choose construction method!
    sa.construct_arr<2>(true);
    //sa.construct_arr<2>();
    double end = t.elapsed() - start;
    if (rank == 0)
        std::cerr << "PSAC time: " << end << " ms" << std::endl;
    std::vector<index_t> glSA = mxx::gatherv(sa.local_SA, 0);


    // run construction with divsufsort locally on rank 0
    if (rank == 0) {
        mxx::timer t;
        std::vector<index_t> SA;
        double start = t.elapsed();
        dss::construct(input_str.begin(), input_str.end(), SA);
        double end = t.elapsed() - start;
        std::cerr << "divsufsort time: " << end << " ms" << std::endl;

        // check correctness if we should do so!
        if (checkArg.getValue()) {
            std::cerr << "Checking for correctness..." << std::endl;
            if(!dss::check(input_str.begin(), input_str.end(), glSA)) {
                std::cerr << "ERROR: wrong suffix array from PSAC" << std::endl;
                return false;
            }
            if(!dss::check(input_str.begin(), input_str.end(), SA)) {
                std::cerr << "ERROR: wrong suffix array from divsufsort" << std::endl;
            }
        }
    }

    // catch any TCLAP exception
    } catch (TCLAP::ArgException& e) {
        std::cerr << "error: " << e.error() << " for arg " << e.argId() << std::endl;
        exit(EXIT_FAILURE);
    }

    // finalize MPI
    MPI_Finalize();

    return 0;
}